

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

void __thiscall msgpack11::MsgPack::MsgPack(MsgPack *this,binary *values)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  binary *values_local;
  MsgPack *this_local;
  
  local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)values;
  values_local = (binary *)this;
  std::
  make_shared<msgpack11::MsgPackBinary,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_28);
  std::shared_ptr<msgpack11::MsgPackValue>::shared_ptr<msgpack11::MsgPackBinary,void>
            (&this->m_ptr,(shared_ptr<msgpack11::MsgPackBinary> *)&local_28);
  std::shared_ptr<msgpack11::MsgPackBinary>::~shared_ptr
            ((shared_ptr<msgpack11::MsgPackBinary> *)&local_28);
  return;
}

Assistant:

MsgPack::MsgPack(MsgPack::binary &&values)         : m_ptr(make_shared<MsgPackBinary>(move(values))) {}